

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O0

void static_task(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  ContextOptions *pCVar2;
  Expression_lhs<const_bool> this;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  Expression_lhs<const_std::atomic<unsigned_long>_&> EVar3;
  ResultBuilder DOCTEST_RB_6;
  ResultBuilder DOCTEST_RB_5;
  runtime_error *e;
  ResultBuilder DOCTEST_RB_4;
  ResultBuilder DOCTEST_RB_3;
  type *anon_var_0;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task F;
  Task E;
  Task D;
  Task C;
  Task B;
  Task A;
  atomic<unsigned_long> counter;
  Executor executor;
  Taskflow taskflow;
  Task *in_stack_fffffffffffff7e8;
  Result *pRVar4;
  Taskflow *in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff7fc;
  future<void> *in_stack_fffffffffffff800;
  Enum in_stack_fffffffffffff80c;
  Taskflow *in_stack_fffffffffffff810;
  char *in_stack_fffffffffffff820;
  anon_class_8_1_bc7188dc *in_stack_fffffffffffff830;
  undefined2 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff83a;
  undefined1 in_stack_fffffffffffff83b;
  undefined4 in_stack_fffffffffffff83c;
  Expression_lhs<const_bool> *in_stack_fffffffffffff868;
  int *in_stack_fffffffffffff870;
  Expression_lhs<const_std::atomic<unsigned_long>_&> *in_stack_fffffffffffff878;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff8d8;
  size_t in_stack_fffffffffffff8e0;
  Executor *in_stack_fffffffffffff8e8;
  ExpressionDecomposer local_61c;
  Expression_lhs<const_bool> local_618;
  ResultBuilder local_5f0;
  undefined4 local_554;
  atomic<unsigned_long> *local_550;
  Enum local_548;
  ExpressionDecomposer local_53c;
  atomic<unsigned_long> *local_538;
  Enum local_530;
  ResultBuilder local_508;
  ResultBuilder local_468;
  undefined4 local_3ec;
  atomic<unsigned_long> *local_3e8;
  Enum local_3e0;
  ExpressionDecomposer local_3d4;
  atomic<unsigned_long> *local_3d0;
  Enum local_3c8;
  ResultBuilder local_3a0;
  ResultBuilder local_308;
  undefined8 *local_290;
  undefined8 *local_280;
  undefined8 *local_270;
  undefined8 *local_260;
  undefined8 *local_250;
  undefined8 *local_240;
  undefined8 local_230 [70];
  
  tf::Taskflow::Taskflow(in_stack_fffffffffffff810);
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x119673);
  local_230[0] = 0;
  local_240 = local_230;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:17:29),_nullptr>
            ((FlowBuilder *)
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             in_stack_fffffffffffff830);
  local_250 = local_230;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:18:29),_nullptr>
            ((FlowBuilder *)
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             in_stack_fffffffffffff830);
  local_260 = local_230;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:19:29),_nullptr>
            ((FlowBuilder *)
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             in_stack_fffffffffffff830);
  local_270 = local_230;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:20:29),_nullptr>
            ((FlowBuilder *)
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             in_stack_fffffffffffff830);
  local_280 = local_230;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:21:29),_nullptr>
            ((FlowBuilder *)
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             in_stack_fffffffffffff830);
  local_290 = local_230;
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:22:29),_nullptr>
            ((FlowBuilder *)
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             in_stack_fffffffffffff830);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
             (char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
             (char *)in_stack_fffffffffffff7f0,"",in_stack_fffffffffffff820);
  tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                    in_stack_fffffffffffff7f0);
  std::future<void>::get(in_stack_fffffffffffff800);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff7f0);
  doctest::detail::ResultBuilder::log(&local_308,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff7f0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x119992);
  pRVar4 = (Result *)0x1d263f;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
             (char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
             (char *)in_stack_fffffffffffff7f0,"",in_stack_fffffffffffff820);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3d4,DT_REQUIRE);
  EVar3 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<unsigned_long>,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffff7f0,
                     (atomic<unsigned_long> *)pRVar4);
  local_3e8 = EVar3.lhs;
  local_3e0 = EVar3.m_at;
  local_3ec = 6;
  local_3d0 = local_3e8;
  local_3c8 = local_3e0;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff7f0,pRVar4);
  doctest::detail::Result::~Result((Result *)0x119a82);
  doctest::detail::ResultBuilder::log(&local_3a0,__x_00);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff7f0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x119b67);
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff800,
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  tf::Task::work<static_task(unsigned_int)::__6>
            ((Task *)in_stack_fffffffffffff7f0,(anon_class_1_0_00000001 *)pRVar4);
  pCVar2 = doctest::getContextOptions();
  if ((pCVar2->no_throw & 1U) == 0) {
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
               (char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               (char *)in_stack_fffffffffffff7f0,"x",in_stack_fffffffffffff820);
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                      in_stack_fffffffffffff7f0);
    std::future<void>::get(in_stack_fffffffffffff800);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff7f0);
    doctest::detail::ResultBuilder::log(&local_468,__x_01);
    if ((extraout_AL_01 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff7f0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x119d5c);
  }
  pRVar4 = (Result *)0x1d263f;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
             (char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
             (char *)in_stack_fffffffffffff7f0,"",in_stack_fffffffffffff820);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_53c,DT_REQUIRE);
  EVar3 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<unsigned_long>,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffff7f0,
                     (atomic<unsigned_long> *)pRVar4);
  local_550 = EVar3.lhs;
  local_548 = EVar3.m_at;
  local_554 = 2;
  local_538 = local_550;
  local_530 = local_548;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff7f0,pRVar4);
  doctest::detail::Result::~Result((Result *)0x119e62);
  doctest::detail::ResultBuilder::log(&local_508,__x_02);
  if ((extraout_AL_02 & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff7f0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x119f35);
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)in_stack_fffffffffffff800,
               CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                      in_stack_fffffffffffff7f0);
    std::future<void>::get(in_stack_fffffffffffff800);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff7f0);
    pRVar4 = (Result *)0x1d263f;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff810,in_stack_fffffffffffff80c,
               (char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               (char *)in_stack_fffffffffffff7f0,"",in_stack_fffffffffffff820);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_61c,DT_REQUIRE);
    this = doctest::detail::ExpressionDecomposer::operator<<
                     ((ExpressionDecomposer *)
                      CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                      (bool *)in_stack_fffffffffffff7f0);
    local_618 = this;
    doctest::detail::Expression_lhs::operator_cast_to_Result(in_stack_fffffffffffff868);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff7f0,pRVar4);
    doctest::detail::Result::~Result((Result *)0x11a037);
    doctest::detail::ResultBuilder::log(&local_5f0,__x_03);
    if ((extraout_AL_03 & 1) == 0) {
      doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff7f0);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11a158);
      tf::Executor::~Executor((Executor *)this);
      tf::Taskflow::~Taskflow(in_stack_fffffffffffff7f0);
      return;
    }
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void static_task(unsigned W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter(0);

  auto A = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto B = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto C = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto D = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto E = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto F = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  E.precede(F);

  REQUIRE_NOTHROW(executor.run(taskflow).get());
  REQUIRE(counter == 6);

  counter = 0;
  C.work([](){ throw std::runtime_error("x"); });
  
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "x", std::runtime_error);
  REQUIRE(counter == 2);

  try {
    counter = 0;
    executor.run(taskflow).get();
    REQUIRE(false);
  }
  catch(std::runtime_error& e) {
    REQUIRE(counter == 2);
    REQUIRE(std::strcmp(e.what(), "x") == 0);
  }
}